

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

char * leveldb::EncodeVarint64(char *dst,uint64_t v)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (; 0x7f < v; v = v >> 7) {
    *dst = (byte)v | 0x80;
    dst = (char *)((byte *)dst + 1);
  }
  *dst = (byte)v;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (char *)((byte *)dst + 1);
  }
  __stack_chk_fail();
}

Assistant:

char* EncodeVarint64(char* dst, uint64_t v) {
  static const int B = 128;
  uint8_t* ptr = reinterpret_cast<uint8_t*>(dst);
  while (v >= B) {
    *(ptr++) = v | B;
    v >>= 7;
  }
  *(ptr++) = static_cast<uint8_t>(v);
  return reinterpret_cast<char*>(ptr);
}